

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O2

void nested_markable::test_opt_opt_int(void)

{
  reference_type rVar1;
  reference_type piVar2;
  markable<ak_toolkit::markable_ns::mark_int<int,__1>,_ak_toolkit::markable_ns::order_none> local_10
  ;
  markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none> local_c;
  
  local_c._storage = -1;
  rVar1 = ak_toolkit::markable_ns::
          markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::value
                    (&local_c);
  if (rVar1._storage != -1) {
    __assert_fail("!ooi.value().has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x480,"void nested_markable::test_opt_opt_int()");
  }
  if (local_c._storage != -1) {
    __assert_fail("-1 == ooi.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x481,"void nested_markable::test_opt_opt_int()");
  }
  local_c._storage = 1;
  rVar1 = ak_toolkit::markable_ns::
          markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::value
                    (&local_c);
  if (rVar1._storage == -1) {
    __assert_fail("ooi.value().has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x485,"void nested_markable::test_opt_opt_int()");
  }
  local_10._storage =
       (storage_type)
       ak_toolkit::markable_ns::
       markable<nested_markable::mark_minus_2,_ak_toolkit::markable_ns::order_none>::value(&local_c)
  ;
  piVar2 = ak_toolkit::markable_ns::
           markable<ak_toolkit::markable_ns::mark_int<int,_-1>,_ak_toolkit::markable_ns::order_none>
           ::value(&local_10);
  if (*piVar2 == 1) {
    if (local_c._storage == 1) {
      return;
    }
    __assert_fail("1 == ooi.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x487,"void nested_markable::test_opt_opt_int()");
  }
  __assert_fail("ooi.value().value() == true",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                ,0x486,"void nested_markable::test_opt_opt_int()");
}

Assistant:

void test_opt_opt_int()
  {
    static_assert(sizeof(optopt_int) == sizeof(int), "excessive size");
    optopt_int ooi {};
    assert(!ooi.has_value());
    assert(-2 == ooi.representation_value());


    opt_int oi {};
    assert(-1 == oi.representation_value());
    assert(!oi.has_value());

    ooi.assign(oi);
    assert(ooi.has_value());
    assert(!ooi.value().has_value());
    assert(-1 == ooi.representation_value());

    ooi.assign(opt_int{1});
    assert(ooi.has_value());
    assert(ooi.value().has_value());
    assert(ooi.value().value() == true);
    assert(1 == ooi.representation_value());
  }